

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_ps_enum(stb_ps *ps,void *data,_func_int_void_ptr_void_ptr *func)

{
  int iVar1;
  stb_ps_hash *h;
  stb_ps_array *a;
  stb_ps_bucket *b;
  int i;
  _func_int_void_ptr_void_ptr *func_local;
  void *data_local;
  stb_ps *ps_local;
  
  data_local._0_4_ = (uint)ps;
  switch((uint)data_local & 3) {
  case 0:
    if (ps == (stb_ps *)0x0) {
      ps_local._4_4_ = 1;
    }
    else {
      ps_local._4_4_ = (*func)(ps,data);
    }
    break;
  case 1:
    for (b._4_4_ = 0; b._4_4_ < 4; b._4_4_ = b._4_4_ + 1) {
      if ((*(long *)(ps + (long)b._4_4_ * 8 + -1) != 0) &&
         (iVar1 = (*func)(*(void **)(ps + (long)b._4_4_ * 8 + -1),data), iVar1 == 0)) {
        return 0;
      }
    }
    ps_local._4_4_ = 1;
    break;
  case 2:
    for (b._4_4_ = 0; b._4_4_ < *(int *)(ps + -2); b._4_4_ = b._4_4_ + 1) {
      iVar1 = (*func)(*(void **)(ps + (long)b._4_4_ * 8 + 6),data);
      if (iVar1 == 0) {
        return 0;
      }
    }
    ps_local._4_4_ = 1;
    break;
  case 3:
    for (b._4_4_ = 0; b._4_4_ < *(int *)(ps + 5); b._4_4_ = b._4_4_ + 1) {
      if ((1 < (uint)*(undefined8 *)(ps + (long)b._4_4_ * 8 + 0x1d)) &&
         (iVar1 = (*func)(*(void **)(ps + (long)b._4_4_ * 8 + 0x1d),data), iVar1 == 0)) {
        return 0;
      }
    }
    ps_local._4_4_ = 1;
    break;
  default:
    ps_local._4_4_ = 1;
  }
  return ps_local._4_4_;
}

Assistant:

int stb_ps_enum(stb_ps *ps, void *data, int (*func)(void *value, void *data))
{
   int i;
   switch (3 & (int) ps) {
      case STB_ps_direct:
         if (ps == NULL) return STB_TRUE;
         return func(ps, data);
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         for (i=0; i < STB_BUCKET_SIZE; ++i)
            if (b->p[i] != NULL)
               if (!func(b->p[i], data))
                  return STB_FALSE;
         return STB_TRUE;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         for (i=0; i < a->count; ++i)
            if (!func(a->p[i], data))
               return STB_FALSE;
         return STB_TRUE;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         for (i=0; i < h->count; ++i)
            if (!stb_ps_empty(h->table[i]))
               if (!func(h->table[i], data))
                  return STB_FALSE;
         return STB_TRUE;
      }
   }
   return STB_TRUE; /* NOTREACHED */
}